

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O3

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,DSPOMDP *model,StateIndexer *indexer,ACT_TYPE action,OBS_TYPE obs)

{
  pointer *pppSVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  log_ostream *plVar3;
  int s;
  uint uVar4;
  double extraout_XMM0_Qa;
  State *particle;
  State *local_38;
  
  if (indexer != (StateIndexer *)0x0) {
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = 0;
    while( true ) {
      iVar2 = (*indexer->_vptr_StateIndexer[2])(indexer);
      if (iVar2 <= (int)uVar4) break;
      iVar2 = (*indexer->_vptr_StateIndexer[4])(indexer,(ulong)uVar4);
      (*model->_vptr_DSPOMDP[7])(model,obs,CONCAT44(extraout_var,iVar2),(ulong)(uint)action);
      if (0.0 < extraout_XMM0_Qa) {
        iVar2 = (*model->_vptr_DSPOMDP[0x16])(model,CONCAT44(extraout_var,iVar2));
        local_38 = (State *)CONCAT44(extraout_var_00,iVar2);
        local_38->weight = extraout_XMM0_Qa;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__
                     ,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppSVar1 = &(__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
      }
      uVar4 = uVar4 + 1;
    }
    return __return_storage_ptr__;
  }
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (0 < iVar2) {
      plVar3 = logging::stream(1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"[Belief::Resample] indexer cannot be null",0x29);
      std::endl<char,std::char_traits<char>>(&plVar3->super_ostream);
    }
  }
  exit(1);
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const DSPOMDP* model,
	const StateIndexer* indexer, ACT_TYPE action, OBS_TYPE obs) {
	if (indexer == NULL) {
		loge << "[Belief::Resample] indexer cannot be null" << endl;
		exit(1);
	}

	vector<State*> sample;

	for (int s = 0; s < indexer->NumStates(); s++) {
		const State* state = indexer->GetState(s);
		double prob = model->ObsProb(obs, *state, action);
		if (prob > 0) {
			State* particle = model->Copy(state);
			particle->weight = prob;
			sample.push_back(particle);
		}
	}

	return sample;
}